

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.h
# Opt level: O1

void __thiscall gui::TextBox::~TextBox(TextBox *this)

{
  ~TextBox(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~TextBox() = default;